

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_22::ValidateBranchConditional(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_990;
  DiagnosticStream local_7b8;
  Instruction *local_5e0;
  Instruction *false_target;
  undefined1 local_5d0 [4];
  uint false_id;
  Instruction *local_3f8;
  Instruction *true_target;
  undefined1 local_3e8 [4];
  uint true_id;
  Instruction *local_210;
  Instruction *cond_op;
  undefined1 local_200 [4];
  uint cond_id;
  size_type local_28;
  size_type num_operands;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  num_operands = (size_type)inst;
  inst_local = (Instruction *)_;
  this_00 = Instruction::operands(inst);
  local_28 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this_00)
  ;
  if ((local_28 == 3) || (local_28 == 5)) {
    cond_op._4_4_ = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,0);
    local_210 = ValidationState_t::FindDef((ValidationState_t *)inst_local,cond_op._4_4_);
    if ((local_210 != (Instruction *)0x0) &&
       (uVar2 = Instruction::type_id(local_210), this = inst_local, uVar2 != 0)) {
      uVar2 = Instruction::type_id(local_210);
      bVar1 = ValidationState_t::IsBoolScalarType((ValidationState_t *)this,uVar2);
      if (bVar1) {
        true_target._4_4_ = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,1);
        local_3f8 = ValidationState_t::FindDef((ValidationState_t *)inst_local,true_target._4_4_);
        if ((local_3f8 == (Instruction *)0x0) ||
           (OVar3 = Instruction::opcode(local_3f8), OVar3 != OpLabel)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)local_5d0,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_ID,(Instruction *)num_operands);
          pDVar4 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_5d0,
                              (char (*) [90])
                              "The \'True Label\' operand for OpBranchConditional must be the ID of an OpLabel instruction"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5d0);
          return __local._4_4_;
        }
        false_target._4_4_ = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_operands,2);
        local_5e0 = ValidationState_t::FindDef((ValidationState_t *)inst_local,false_target._4_4_);
        if ((local_5e0 != (Instruction *)0x0) &&
           (OVar3 = Instruction::opcode(local_5e0), OVar3 == OpLabel)) {
          uVar2 = ValidationState_t::version((ValidationState_t *)inst_local);
          if ((0x105ff < uVar2) && (true_target._4_4_ == false_target._4_4_)) {
            ValidationState_t::diag
                      (&local_990,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                       (Instruction *)num_operands);
            pDVar4 = DiagnosticStream::operator<<
                               (&local_990,
                                (char (*) [76])
                                "In SPIR-V 1.6 or later, True Label and False Label must be different labels"
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_990);
            return __local._4_4_;
          }
          return SPV_SUCCESS;
        }
        ValidationState_t::diag
                  (&local_7b8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)num_operands);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_7b8,
                            (char (*) [91])
                            "The \'False Label\' operand for OpBranchConditional must be the ID of an OpLabel instruction"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_7b8);
        return __local._4_4_;
      }
    }
    ValidationState_t::diag
              ((DiagnosticStream *)local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)num_operands);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_3e8,
                        (char (*) [66])
                        "Condition operand for OpBranchConditional must be of boolean type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e8);
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)num_operands);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_200,
                        (char (*) [54])"OpBranchConditional requires either 3 or 5 parameters");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateBranchConditional(ValidationState_t& _,
                                       const Instruction* inst) {
  // num_operands is either 3 or 5 --- if 5, the last two need to be literal
  // integers
  const auto num_operands = inst->operands().size();
  if (num_operands != 3 && num_operands != 5) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpBranchConditional requires either 3 or 5 parameters";
  }

  // grab the condition operand and check that it is a bool
  const auto cond_id = inst->GetOperandAs<uint32_t>(0);
  const auto cond_op = _.FindDef(cond_id);
  if (!cond_op || !cond_op->type_id() ||
      !_.IsBoolScalarType(cond_op->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Condition operand for "
                                                 "OpBranchConditional must be "
                                                 "of boolean type";
  }

  // target operands must be OpLabel
  // note that we don't need to check that the target labels are in the same
  // function,
  // PerformCfgChecks already checks for that
  const auto true_id = inst->GetOperandAs<uint32_t>(1);
  const auto true_target = _.FindDef(true_id);
  if (!true_target || spv::Op::OpLabel != true_target->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The 'True Label' operand for OpBranchConditional must be the "
              "ID of an OpLabel instruction";
  }

  const auto false_id = inst->GetOperandAs<uint32_t>(2);
  const auto false_target = _.FindDef(false_id);
  if (!false_target || spv::Op::OpLabel != false_target->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The 'False Label' operand for OpBranchConditional must be the "
              "ID of an OpLabel instruction";
  }

  // A similar requirement for SPV_KHR_maximal_reconvergence is deferred until
  // entry point call trees have been reconrded.
  if (_.version() >= SPV_SPIRV_VERSION_WORD(1, 6) && true_id == false_id) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "In SPIR-V 1.6 or later, True Label and False Label must be "
              "different labels";
  }

  return SPV_SUCCESS;
}